

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8f10e::ir_constant_propagation_visitor::handle_rvalue
          (ir_constant_propagation_visitor *this,ir_rvalue **rvalue)

{
  ir_node_type iVar1;
  ir_rvalue *piVar2;
  glsl_type *type;
  exec_list *peVar3;
  ir_rvalue *piVar4;
  void *mem_ctx;
  ir_constant *this_00;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ir_rvalue *ptr;
  exec_node *peVar8;
  uint uVar9;
  ir_constant_data data;
  ir_constant_data local_b8;
  
  if (((this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
       in_assignee == false) && (piVar2 = *rvalue, piVar2 != (ir_rvalue *)0x0)) {
    type = piVar2->type;
    if ((type->vector_elements == 1 && (*(uint *)&type->field_0x4 & 0xfe) < 0xe) ||
       ((*(uint *)&type->field_0x4 & 0xfc) < 0xc &&
        (type->matrix_columns == '\x01' && 1 < type->vector_elements))) {
      iVar1 = (piVar2->super_ir_instruction).ir_type;
      piVar4 = (ir_rvalue *)0x0;
      ptr = (ir_rvalue *)0x0;
      if (iVar1 == ir_type_dereference_variable) {
        ptr = piVar2;
      }
      if (ptr == (ir_rvalue *)0x0) {
        piVar4 = (ir_rvalue *)0x0;
        if (iVar1 == ir_type_swizzle) {
          piVar4 = piVar2;
        }
        if (piVar4 == (ir_rvalue *)0x0) goto LAB_0018018d;
        piVar2 = (ir_rvalue *)piVar4[1].super_ir_instruction._vptr_ir_instruction;
        ptr = (ir_rvalue *)0x0;
        if ((piVar2->super_ir_instruction).ir_type == ir_type_dereference_variable) {
          ptr = piVar2;
        }
        if (ptr == (ir_rvalue *)0x0) goto LAB_0018018d;
      }
      local_b8.d[0xe] = 0.0;
      local_b8.d[0xf] = 0.0;
      local_b8.d[0xc] = 0.0;
      local_b8.d[0xd] = 0.0;
      local_b8.d[10] = 0.0;
      local_b8.d[0xb] = 0.0;
      local_b8.d[8] = 0.0;
      local_b8.d[9] = 0.0;
      local_b8.d[6] = 0.0;
      local_b8.d[7] = 0.0;
      local_b8.d[4] = 0.0;
      local_b8.d[5] = 0.0;
      local_b8.d[2] = 0.0;
      local_b8.d[3] = 0.0;
      local_b8.d[0] = 0.0;
      local_b8.d[1] = 0.0;
      if (type->matrix_columns != '\0' && type->vector_elements != '\0') {
        peVar3 = this->acp;
        uVar7 = 0;
        do {
          uVar5 = (uint)uVar7;
          if (piVar4 != (ir_rvalue *)0x0) {
            switch(uVar7 & 0xffffffff) {
            case 0:
              uVar5 = (uint)*(ushort *)&piVar4[1].super_ir_instruction.super_exec_node.next;
              break;
            case 1:
              uVar5 = *(uint *)&piVar4[1].super_ir_instruction.super_exec_node.next >> 2;
              break;
            case 2:
              uVar5 = *(uint *)&piVar4[1].super_ir_instruction.super_exec_node.next >> 4;
              break;
            case 3:
              uVar5 = *(uint *)&piVar4[1].super_ir_instruction.super_exec_node.next >> 6;
              break;
            default:
              __assert_fail("!\"shouldn\'t be reached\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                            ,0xb7,
                            "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                           );
            }
            uVar5 = uVar5 & 3;
          }
          peVar8 = (peVar3->head_sentinel).next;
          if (peVar8->next != (exec_node *)0x0) {
            do {
              if ((peVar8[1].next == (exec_node *)ptr[1].super_ir_instruction._vptr_ir_instruction)
                 && ((*(uint *)&peVar8[2].next & 1 << ((byte)uVar5 & 0x1f)) != 0))
              goto LAB_00180072;
              peVar8 = peVar8->next;
            } while (peVar8->next != (exec_node *)0x0);
          }
          peVar8 = (exec_node *)0x0;
LAB_00180072:
          if (peVar8 == (exec_node *)0x0) goto LAB_0018018d;
          if (uVar5 == 0) {
            uVar6 = 0;
          }
          else {
            uVar5 = uVar5 - 1;
            if (2 < uVar5) {
              uVar5 = 3;
            }
            uVar9 = 0;
            uVar6 = 0;
            do {
              uVar6 = (ulong)((int)uVar6 +
                             (uint)((*(uint *)((long)&peVar8[2].next + 4) >> (uVar9 & 0x1f) & 1) !=
                                   0));
              uVar9 = uVar9 + 1;
            } while (uVar5 + 1 != uVar9);
          }
          switch(type->field_0x4) {
          case 0:
          case 1:
            *(undefined4 *)((long)&local_b8 + uVar7 * 4) =
                 *(undefined4 *)((long)&peVar8[1].prev[2].prev + uVar6 * 4);
            break;
          case 2:
            *(undefined4 *)((long)&local_b8 + uVar7 * 4) =
                 *(undefined4 *)((long)&peVar8[1].prev[2].prev + uVar6 * 4);
            break;
          case 3:
            *(undefined2 *)((long)&local_b8 + uVar7 * 2) =
                 *(undefined2 *)((long)&peVar8[1].prev[2].prev + uVar6 * 2);
            break;
          case 4:
            *(exec_node **)((long)&local_b8 + uVar7 * 8) = (&peVar8[1].prev[2].prev)[uVar6];
            break;
          default:
            __assert_fail("!\"not reached\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                          ,0xe9,
                          "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                         );
          case 9:
          case 10:
            *(exec_node **)((long)&local_b8 + uVar7 * 8) = (&peVar8[1].prev[2].prev)[uVar6];
            break;
          case 0xb:
            local_b8.b[uVar7] = *(bool *)((long)&peVar8[1].prev[2].prev + uVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)type->matrix_columns * (ulong)type->vector_elements);
      }
      mem_ctx = ralloc_parent(ptr);
      this_00 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
      ir_constant::ir_constant(this_00,type,&local_b8);
      *rvalue = (ir_rvalue *)this_00;
      this->progress = true;
    }
  }
LAB_0018018d:
  constant_folding(this,rvalue);
  return;
}

Assistant:

void
ir_constant_propagation_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   constant_propagation(rvalue);
   constant_folding(rvalue);
}